

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ntileStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  long *plVar1;
  sqlite3_int64 sVar2;
  NtileCtx *p;
  sqlite3_value **apArg_local;
  int nArg_local;
  sqlite3_context *pCtx_local;
  
  plVar1 = (long *)sqlite3_aggregate_context(pCtx,0x18);
  if (plVar1 != (long *)0x0) {
    if (*plVar1 == 0) {
      sVar2 = sqlite3_value_int64(*apArg);
      plVar1[1] = sVar2;
      if (plVar1[1] < 1) {
        sqlite3_result_error(pCtx,"argument of ntile must be a positive integer",-1);
      }
    }
    *plVar1 = *plVar1 + 1;
  }
  return;
}

Assistant:

static void ntileStepFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct NtileCtx *p;
  assert( nArg==1 ); UNUSED_PARAMETER(nArg);
  p = (struct NtileCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    if( p->nTotal==0 ){
      p->nParam = sqlite3_value_int64(apArg[0]);
      if( p->nParam<=0 ){
        sqlite3_result_error(
            pCtx, "argument of ntile must be a positive integer", -1
        );
      }
    }
    p->nTotal++;
  }
}